

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O2

int __thiscall cmCPackArchiveGenerator::InitializeInternal(cmCPackArchiveGenerator *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",&local_31);
  cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_30,"1");
  std::__cxx11::string::~string((string *)&local_30);
  iVar1 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
  return iVar1;
}

Assistant:

int cmCPackArchiveGenerator::InitializeInternal()
{
  this->SetOptionIfNotSet("CPACK_INCLUDE_TOPLEVEL_DIRECTORY", "1");
  return this->Superclass::InitializeInternal();
}